

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O1

string * __thiscall
CodeGen::generateType_abi_cxx11_(string *__return_storage_ptr__,CodeGen *this,NodePtr *n)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  NodePtr nn;
  NodePtr local_20;
  
  peVar2 = n->px;
  if (peVar2->type_ == AVRO_NUM_TYPES) {
    avro::resolveSymbol((avro *)&local_20,n);
  }
  else {
    local_20.pn.pi_ = (n->pn).pi_;
    local_20.px = peVar2;
    if ((_Base_ptr)local_20.pn.pi_ != (_Base_ptr)0x0) {
      LOCK();
      *(uint_least32_t *)&((_Base_ptr)local_20.pn.pi_)->_M_parent =
           *(uint_least32_t *)&((_Base_ptr)local_20.pn.pi_)->_M_parent + 1;
      UNLOCK();
    }
  }
  p_Var1 = &(this->done)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->done)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[bVar6]) {
    bVar6 = p_Var5[1]._M_parent < local_20.pn.pi_;
    if (!bVar6) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (p_Var5 = p_Var4, local_20.pn.pi_ < p_Var4[1]._M_parent)) {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    doGenerateType_abi_cxx11_(__return_storage_ptr__,this,&local_20);
    pmVar3 = std::
             map<boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->done,&local_20);
    std::__cxx11::string::_M_assign((string *)pmVar3);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,p_Var5[1]._M_left,
               (long)&(p_Var5[1]._M_left)->_M_color + (long)&(p_Var5[1]._M_right)->_M_color);
  }
  boost::detail::shared_count::~shared_count(&local_20.pn);
  return __return_storage_ptr__;
}

Assistant:

string CodeGen::generateType(const NodePtr& n)
{
    NodePtr nn = (n->type() == avro::AVRO_SYMBOLIC) ?  resolveSymbol(n) : n;

    map<NodePtr, string>::const_iterator it = done.find(nn);
    if (it != done.end()) {
        return it->second;
    }
    string result = doGenerateType(nn);
    done[nn] = result;
    return result;
}